

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O2

ColumnBinding __thiscall
duckdb::LateMaterialization::ConstructRHS
          (LateMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  LogicalOperator *this_00;
  ColumnBinding CVar1;
  sbyte sVar2;
  int iVar3;
  pointer pLVar4;
  reference pvVar5;
  LogicalGet *get;
  vector<duckdb::ColumnIndex,_true> *pvVar6;
  reference pvVar7;
  LogicalFilter *pLVar8;
  LogicalProjection *pLVar9;
  InternalException *this_01;
  pointer pCVar10;
  pointer pCVar11;
  long lVar12;
  pointer *__ptr;
  size_type __n;
  long *local_88;
  reference<LogicalOperator> child;
  ColumnBinding local_78;
  string local_68;
  vector<std::reference_wrapper<duckdb::LogicalOperator>,_true> stack;
  
  stack.
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stack.
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  pvVar5 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&pLVar4->children,0);
  child._M_data =
       unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
       operator*(pvVar5);
  while ((child._M_data)->type != LOGICAL_GET) {
    ::std::
    vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
    ::push_back(&stack.
                 super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                ,&child);
    pvVar5 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(&(child._M_data)->children,0);
    child._M_data =
         unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
         operator*(pvVar5);
  }
  get = LogicalOperator::Cast<duckdb::LogicalGet>(child._M_data);
  local_78.column_index = GetOrInsertRowId(this,get);
  pCVar10 = (pointer)(get->projection_ids).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
  pCVar11 = (pointer)(get->projection_ids).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
  if (pCVar10 == pCVar11) {
    pvVar6 = LogicalGet::GetColumnIds(get);
    pCVar10 = (pvVar6->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
              super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar11 = (pvVar6->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
              super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
              super__Vector_impl_data._M_finish;
    sVar2 = 5;
  }
  else {
    sVar2 = 3;
  }
  lVar12 = (long)pCVar11 - (long)pCVar10 >> sVar2;
  local_78.table_index = get->table_index;
  __n = (long)stack.
              super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)stack.
              super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3;
  while( true ) {
    while( true ) {
      __n = __n - 1;
      if (__n == 0xffffffffffffffff) {
        ::std::
        _Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
        ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                         *)&stack);
        CVar1.column_index = local_78.column_index;
        CVar1.table_index = local_78.table_index;
        return CVar1;
      }
      pvVar7 = vector<std::reference_wrapper<duckdb::LogicalOperator>,_true>::get<true>(&stack,__n);
      this_00 = pvVar7->_M_data;
      if (this_00->type != LOGICAL_FILTER) break;
      pLVar8 = LogicalOperator::Cast<duckdb::LogicalFilter>(this_00);
      iVar3 = (*(pLVar8->super_LogicalOperator)._vptr_LogicalOperator[0xc])(pLVar8);
      if ((char)iVar3 != '\0') {
        local_68._M_dataplus._M_p = (pointer)(lVar12 + -1);
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pLVar8->projection_map,
                   (unsigned_long *)&local_68);
      }
    }
    if (this_00->type != LOGICAL_PROJECTION) break;
    pLVar9 = LogicalOperator::Cast<duckdb::LogicalProjection>(this_00);
    make_uniq<duckdb::BoundColumnRefExpression,char_const(&)[6],duckdb::LogicalType&,duckdb::ColumnBinding&>
              ((duckdb *)&local_88,(char (*) [6])0x1040564,&this->row_id_type,&local_78);
    local_68._M_dataplus._M_p = (pointer)local_88;
    local_88 = (long *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&(pLVar9->super_LogicalOperator).expressions,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_68);
    if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
    }
    local_68._M_dataplus._M_p = (pointer)0x0;
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
    local_78.table_index = pLVar9->table_index;
    lVar12 = (long)(pLVar9->super_LogicalOperator).expressions.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pLVar9->super_LogicalOperator).expressions.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    local_78.column_index = lVar12 - 1;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_68,"Unsupported logical operator in LateMaterialization::ConstructRHS"
             ,(allocator *)&local_88);
  InternalException::InternalException(this_01,&local_68);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ColumnBinding LateMaterialization::ConstructRHS(unique_ptr<LogicalOperator> &op) {
	// traverse down until we reach the LogicalGet
	vector<reference<LogicalOperator>> stack;
	reference<LogicalOperator> child = *op->children[0];
	while (child.get().type != LogicalOperatorType::LOGICAL_GET) {
		stack.push_back(child);
		D_ASSERT(child.get().children.size() == 1);
		child = *child.get().children[0];
	}
	// we have reached the logical get - now we need to push the row-id column (if it is not yet projected out)
	auto &get = child.get().Cast<LogicalGet>();
	auto row_id_idx = GetOrInsertRowId(get);
	idx_t column_count = get.projection_ids.empty() ? get.GetColumnIds().size() : get.projection_ids.size();
	D_ASSERT(column_count == get.GetColumnBindings().size());

	// the row id has been projected - now project it up the stack
	ColumnBinding row_id_binding(get.table_index, row_id_idx);
	for (idx_t i = stack.size(); i > 0; i--) {
		auto &op = stack[i - 1].get();
		switch (op.type) {
		case LogicalOperatorType::LOGICAL_PROJECTION: {
			auto &proj = op.Cast<LogicalProjection>();
			// push a projection of the row-id column
			proj.expressions.push_back(make_uniq<BoundColumnRefExpression>("rowid", row_id_type, row_id_binding));
			// modify the row-id-binding to push to the new projection
			row_id_binding = ColumnBinding(proj.table_index, proj.expressions.size() - 1);
			column_count = proj.expressions.size();
			break;
		}
		case LogicalOperatorType::LOGICAL_FILTER: {
			auto &filter = op.Cast<LogicalFilter>();
			// column bindings pass-through this operator as-is UNLESS the filter has a projection map
			if (filter.HasProjectionMap()) {
				// if the filter has a projection map, we need to project the new column
				filter.projection_map.push_back(column_count - 1);
			}
			break;
		}
		default:
			throw InternalException("Unsupported logical operator in LateMaterialization::ConstructRHS");
		}
	}
	return row_id_binding;
}